

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpMessenger.hpp
# Opt level: O3

void __thiscall
ableton::discovery::
UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_512UL>,_ableton::link::PeerState,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&>
::Impl::broadcastState(Impl *this)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  data_union local_40;
  
  bVar1 = this->mTtl;
  bVar2 = this->mTtlRatio;
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar3 = lVar3 - (this->mLastBroadcastTime).__d.__r;
  lVar5 = SUB168(SEXT816(lVar3) * SEXT816(-0x431bde82d7b634db),8);
  uVar4 = ((lVar5 >> 0x12) - (lVar5 >> 0x3f)) + 0x32;
  if (49999999 < lVar3) {
    uVar4 = (ulong)((uint)bVar1 * 1000) / (ulong)bVar2;
  }
  local_40._0_8_ = uVar4 * 1000000;
  asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
  ::expires_from_now((this->mTimer).mpTimer._M_t.
                     super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_>_>
                     .
                     super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_*,_false>
                     ._M_head_impl,(duration *)&local_40.base);
  platforms::asio::AsioTimer::
  async_wait<ableton::discovery::UdpMessenger<ableton::discovery::IpV4Interface<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,512ul>,ableton::link::PeerState,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&>::Impl::broadcastState()::_lambda(std::error_code)_1_>
            (&this->mTimer,(anon_class_8_1_8991fb9c_for_handler)this);
  if (49999999 < lVar3) {
    multicastEndpoint();
    sendPeerState(this,'\x01',(endpoint *)&local_40.base);
  }
  return;
}

Assistant:

void broadcastState()
    {
      using namespace std::chrono;

      const auto minBroadcastPeriod = milliseconds{50};
      const auto nominalBroadcastPeriod = milliseconds(mTtl * 1000 / mTtlRatio);
      const auto timeSinceLastBroadcast =
        duration_cast<milliseconds>(mTimer.now() - mLastBroadcastTime);

      // The rate is limited to maxBroadcastRate to prevent flooding the network.
      const auto delay = minBroadcastPeriod - timeSinceLastBroadcast;

      // Schedule the next broadcast before we actually send the
      // message so that if sending throws an exception we are still
      // scheduled to try again. We want to keep trying at our
      // interval as long as this instance is alive.
      mTimer.expires_from_now(delay > milliseconds{0} ? delay : nominalBroadcastPeriod);
      mTimer.async_wait([this](const TimerError e) {
        if (!e)
        {
          broadcastState();
        }
      });

      // If we're not delaying, broadcast now
      if (delay < milliseconds{1})
      {
        debug(mIo->log()) << "Broadcasting state";
        sendPeerState(v1::kAlive, multicastEndpoint());
      }
    }